

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemoryReporter.h
# Opt level: O2

int __thiscall jaegertracing::reporters::InMemoryReporter::spansSubmitted(InMemoryReporter *this)

{
  pointer pSVar1;
  pointer pSVar2;
  
  std::mutex::lock(&this->_mutex);
  pSVar1 = (this->_spans).
           super__Vector_base<jaegertracing::Span,_std::allocator<jaegertracing::Span>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar2 = (this->_spans).
           super__Vector_base<jaegertracing::Span,_std::allocator<jaegertracing::Span>_>._M_impl.
           super__Vector_impl_data._M_start;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return (int)(((long)pSVar1 - (long)pSVar2) / 0x170);
}

Assistant:

int spansSubmitted() const noexcept
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _spans.size();
    }